

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::test(disp *this)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  long *in_RDI;
  ostringstream oss_63;
  ostringstream oss_62;
  ostringstream oss_61;
  ostringstream oss_60;
  ostringstream oss_59;
  ostringstream oss_58;
  ostringstream oss_57;
  ostringstream oss_56;
  ostringstream oss_55;
  ostringstream oss_54;
  ostringstream oss_53;
  ostringstream oss_52;
  ostringstream oss_51;
  ostringstream oss_50;
  ostringstream oss_49;
  ostringstream oss_48;
  ostringstream oss_47;
  ostringstream oss_46;
  ostringstream oss_45;
  ostringstream oss_44;
  ostringstream oss_43;
  ostringstream oss_42;
  ostringstream oss_41;
  ostringstream oss_40;
  ostringstream oss_39;
  ostringstream oss_38;
  ostringstream oss_37;
  ostringstream oss_36;
  ostringstream oss_35;
  ostringstream oss_34;
  ostringstream oss_33;
  ostringstream oss_32;
  ostringstream oss_31;
  ostringstream oss_30;
  ostringstream oss_29;
  ostringstream oss_28;
  ostringstream oss_27;
  ostringstream oss_26;
  ostringstream oss_25;
  ostringstream oss_24;
  ostringstream oss_23;
  ostringstream oss_22;
  ostringstream oss_21;
  ostringstream oss_20;
  ostringstream oss_19;
  ostringstream oss_18;
  ostringstream oss_17;
  ostringstream oss_16;
  ostringstream oss_15;
  ostringstream oss_14;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  char *in_stack_ffffffffffff71d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff71e0;
  string *in_stack_ffffffffffff73e8;
  disp *in_stack_ffffffffffff73f0;
  string local_7e50 [32];
  ostringstream local_7e30 [399];
  allocator local_7ca1;
  string local_7ca0 [39];
  allocator local_7c79;
  string local_7c78 [39];
  undefined1 local_7c51;
  string local_7c50 [32];
  ostringstream local_7c30 [399];
  allocator local_7aa1;
  string local_7aa0 [39];
  allocator local_7a79;
  string local_7a78 [39];
  undefined1 local_7a51;
  string local_7a50 [32];
  ostringstream local_7a30 [399];
  allocator local_78a1;
  string local_78a0 [39];
  allocator local_7879;
  string local_7878 [39];
  undefined1 local_7851;
  string local_7850 [32];
  ostringstream local_7830 [399];
  allocator local_76a1;
  string local_76a0 [39];
  allocator local_7679;
  string local_7678 [39];
  undefined1 local_7651;
  string local_7650 [32];
  ostringstream local_7630 [399];
  allocator local_74a1;
  string local_74a0 [39];
  allocator local_7479;
  string local_7478 [39];
  undefined1 local_7451;
  string local_7450 [32];
  ostringstream local_7430 [399];
  allocator local_72a1;
  string local_72a0 [39];
  allocator local_7279;
  string local_7278 [39];
  undefined1 local_7251;
  string local_7250 [32];
  ostringstream local_7230 [399];
  allocator local_70a1;
  string local_70a0 [39];
  allocator local_7079;
  string local_7078 [39];
  undefined1 local_7051;
  string local_7050 [32];
  ostringstream local_7030 [399];
  allocator local_6ea1;
  string local_6ea0 [39];
  allocator local_6e79;
  string local_6e78 [39];
  undefined1 local_6e51;
  string local_6e50 [32];
  ostringstream local_6e30 [399];
  allocator local_6ca1;
  string local_6ca0 [39];
  allocator local_6c79;
  string local_6c78 [39];
  undefined1 local_6c51;
  string local_6c50 [32];
  ostringstream local_6c30 [399];
  allocator local_6aa1;
  string local_6aa0 [39];
  allocator local_6a79;
  string local_6a78 [39];
  undefined1 local_6a51;
  string local_6a50 [32];
  ostringstream local_6a30 [399];
  allocator local_68a1;
  string local_68a0 [39];
  allocator local_6879;
  string local_6878 [39];
  undefined1 local_6851;
  string local_6850 [32];
  ostringstream local_6830 [399];
  allocator local_66a1;
  string local_66a0 [39];
  allocator local_6679;
  string local_6678 [39];
  undefined1 local_6651;
  string local_6650 [32];
  ostringstream local_6630 [399];
  allocator local_64a1;
  string local_64a0 [39];
  allocator local_6479;
  string local_6478 [39];
  undefined1 local_6451;
  string local_6450 [32];
  ostringstream local_6430 [399];
  allocator local_62a1;
  string local_62a0 [39];
  allocator local_6279;
  string local_6278 [39];
  undefined1 local_6251;
  string local_6250 [32];
  ostringstream local_6230 [399];
  allocator local_60a1;
  string local_60a0 [39];
  allocator local_6079;
  string local_6078 [39];
  undefined1 local_6051;
  string local_6050 [32];
  ostringstream local_6030 [399];
  allocator local_5ea1;
  string local_5ea0 [39];
  allocator local_5e79;
  string local_5e78 [39];
  undefined1 local_5e51;
  string local_5e50 [32];
  ostringstream local_5e30 [399];
  allocator local_5ca1;
  string local_5ca0 [39];
  allocator local_5c79;
  string local_5c78 [39];
  undefined1 local_5c51;
  string local_5c50 [32];
  ostringstream local_5c30 [399];
  allocator local_5aa1;
  string local_5aa0 [39];
  allocator local_5a79;
  string local_5a78 [39];
  undefined1 local_5a51;
  string local_5a50 [32];
  ostringstream local_5a30 [399];
  allocator local_58a1;
  string local_58a0 [39];
  allocator local_5879;
  string local_5878 [39];
  undefined1 local_5851;
  string local_5850 [32];
  ostringstream local_5830 [399];
  allocator local_56a1;
  string local_56a0 [39];
  allocator local_5679;
  string local_5678 [39];
  undefined1 local_5651;
  string local_5650 [32];
  ostringstream local_5630 [399];
  allocator local_54a1;
  string local_54a0 [39];
  allocator local_5479;
  string local_5478 [39];
  undefined1 local_5451;
  string local_5450 [32];
  ostringstream local_5430 [399];
  allocator local_52a1;
  string local_52a0 [39];
  allocator local_5279;
  string local_5278 [39];
  undefined1 local_5251;
  string local_5250 [32];
  ostringstream local_5230 [399];
  allocator local_50a1;
  string local_50a0 [39];
  allocator local_5079;
  string local_5078 [39];
  undefined1 local_5051;
  string local_5050 [32];
  ostringstream local_5030 [399];
  allocator local_4ea1;
  string local_4ea0 [39];
  allocator local_4e79;
  string local_4e78 [39];
  undefined1 local_4e51;
  string local_4e50 [32];
  ostringstream local_4e30 [399];
  allocator local_4ca1;
  string local_4ca0 [39];
  allocator local_4c79;
  string local_4c78 [39];
  undefined1 local_4c51;
  string local_4c50 [32];
  ostringstream local_4c30 [399];
  allocator local_4aa1;
  string local_4aa0 [39];
  allocator local_4a79;
  string local_4a78 [39];
  undefined1 local_4a51;
  string local_4a50 [32];
  ostringstream local_4a30 [399];
  allocator local_48a1;
  string local_48a0 [39];
  allocator local_4879;
  string local_4878 [39];
  undefined1 local_4851;
  string local_4850 [32];
  ostringstream local_4830 [399];
  allocator local_46a1;
  string local_46a0 [39];
  allocator local_4679;
  string local_4678 [39];
  undefined1 local_4651;
  string local_4650 [32];
  ostringstream local_4630 [399];
  allocator local_44a1;
  string local_44a0 [39];
  allocator local_4479;
  string local_4478 [39];
  undefined1 local_4451;
  string local_4450 [32];
  ostringstream local_4430 [399];
  allocator local_42a1;
  string local_42a0 [39];
  allocator local_4279;
  string local_4278 [39];
  undefined1 local_4251;
  string local_4250 [32];
  ostringstream local_4230 [399];
  allocator local_40a1;
  string local_40a0 [39];
  allocator local_4079;
  string local_4078 [39];
  undefined1 local_4051;
  string local_4050 [32];
  ostringstream local_4030 [399];
  allocator local_3ea1;
  string local_3ea0 [39];
  allocator local_3e79;
  string local_3e78 [39];
  undefined1 local_3e51;
  string local_3e50 [32];
  ostringstream local_3e30 [399];
  allocator local_3ca1;
  string local_3ca0 [39];
  allocator local_3c79;
  string local_3c78 [39];
  undefined1 local_3c51;
  string local_3c50 [32];
  ostringstream local_3c30 [399];
  allocator local_3aa1;
  string local_3aa0 [39];
  allocator local_3a79;
  string local_3a78 [39];
  undefined1 local_3a51;
  string local_3a50 [32];
  ostringstream local_3a30 [399];
  allocator local_38a1;
  string local_38a0 [39];
  allocator local_3879;
  string local_3878 [39];
  undefined1 local_3851;
  string local_3850 [32];
  ostringstream local_3830 [399];
  allocator local_36a1;
  string local_36a0 [39];
  allocator local_3679;
  string local_3678 [39];
  undefined1 local_3651;
  string local_3650 [32];
  ostringstream local_3630 [399];
  allocator local_34a1;
  string local_34a0 [39];
  allocator local_3479;
  string local_3478 [39];
  undefined1 local_3451;
  string local_3450 [32];
  ostringstream local_3430 [399];
  allocator local_32a1;
  string local_32a0 [39];
  allocator local_3279;
  string local_3278 [39];
  undefined1 local_3251;
  string local_3250 [32];
  ostringstream local_3230 [399];
  allocator local_30a1;
  string local_30a0 [39];
  allocator local_3079;
  string local_3078 [39];
  undefined1 local_3051;
  string local_3050 [32];
  ostringstream local_3030 [399];
  allocator local_2ea1;
  string local_2ea0 [39];
  allocator local_2e79;
  string local_2e78 [39];
  undefined1 local_2e51;
  string local_2e50 [32];
  ostringstream local_2e30 [399];
  allocator local_2ca1;
  string local_2ca0 [39];
  allocator local_2c79;
  string local_2c78 [39];
  undefined1 local_2c51;
  string local_2c50 [32];
  ostringstream local_2c30 [399];
  allocator local_2aa1;
  string local_2aa0 [39];
  allocator local_2a79;
  string local_2a78 [39];
  undefined1 local_2a51;
  string local_2a50 [32];
  ostringstream local_2a30 [399];
  allocator local_28a1;
  string local_28a0 [39];
  allocator local_2879;
  string local_2878 [39];
  undefined1 local_2851;
  string local_2850 [32];
  ostringstream local_2830 [399];
  allocator local_26a1;
  string local_26a0 [39];
  allocator local_2679;
  string local_2678 [39];
  undefined1 local_2651;
  string local_2650 [32];
  ostringstream local_2630 [399];
  allocator local_24a1;
  string local_24a0 [39];
  allocator local_2479;
  string local_2478 [39];
  undefined1 local_2451;
  string local_2450 [32];
  ostringstream local_2430 [399];
  allocator local_22a1;
  string local_22a0 [39];
  allocator local_2279;
  string local_2278 [39];
  undefined1 local_2251;
  string local_2250 [32];
  ostringstream local_2230 [399];
  allocator local_20a1;
  string local_20a0 [39];
  allocator local_2079;
  string local_2078 [39];
  undefined1 local_2051;
  string local_2050 [32];
  ostringstream local_2030 [399];
  allocator local_1ea1;
  string local_1ea0 [39];
  allocator local_1e79;
  string local_1e78 [39];
  undefined1 local_1e51;
  string local_1e50 [32];
  ostringstream local_1e30 [399];
  allocator local_1ca1;
  string local_1ca0 [39];
  allocator local_1c79;
  string local_1c78 [39];
  undefined1 local_1c51;
  string local_1c50 [32];
  ostringstream local_1c30 [399];
  allocator local_1aa1;
  string local_1aa0 [39];
  allocator local_1a79;
  string local_1a78 [39];
  undefined1 local_1a51;
  string local_1a50 [32];
  ostringstream local_1a30 [399];
  allocator local_18a1;
  string local_18a0 [39];
  allocator local_1879;
  string local_1878 [39];
  undefined1 local_1851;
  string local_1850 [32];
  ostringstream local_1830 [399];
  allocator local_16a1;
  string local_16a0 [39];
  allocator local_1679;
  string local_1678 [39];
  undefined1 local_1651;
  string local_1650 [32];
  ostringstream local_1630 [399];
  allocator local_14a1;
  string local_14a0 [39];
  allocator local_1479;
  string local_1478 [39];
  undefined1 local_1451;
  string local_1450 [32];
  ostringstream local_1430 [399];
  allocator local_12a1;
  string local_12a0 [39];
  allocator local_1279;
  string local_1278 [39];
  undefined1 local_1251;
  string local_1250 [32];
  ostringstream local_1230 [399];
  allocator local_10a1;
  string local_10a0 [39];
  allocator local_1079;
  string local_1078 [39];
  undefined1 local_1051;
  string local_1050 [32];
  ostringstream local_1030 [399];
  allocator local_ea1;
  string local_ea0 [39];
  allocator local_e79;
  string local_e78 [39];
  undefined1 local_e51;
  string local_e50 [32];
  ostringstream local_e30 [383];
  allocator local_cb1;
  string local_cb0 [39];
  undefined1 local_c89;
  string local_c88 [32];
  ostringstream local_c68 [383];
  allocator local_ae9;
  string local_ae8 [39];
  undefined1 local_ac1;
  string local_ac0 [32];
  ostringstream local_aa0 [383];
  allocator local_921;
  string local_920 [39];
  undefined1 local_8f9;
  string local_8f8 [32];
  ostringstream local_8d8 [383];
  allocator local_759;
  string local_758 [39];
  undefined1 local_731;
  string local_730 [32];
  ostringstream local_710 [383];
  allocator local_591;
  string local_590 [39];
  undefined1 local_569;
  string local_568 [32];
  ostringstream local_548 [383];
  allocator local_3c9;
  string local_3c8 [39];
  undefined1 local_3a1;
  string local_3a0 [32];
  ostringstream local_380 [383];
  allocator local_201;
  string local_200 [39];
  undefined1 local_1d9;
  string local_1d8 [32];
  ostringstream local_1b8 [399];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"hg/x",&local_29);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar2 = std::operator<<((ostream *)local_1b8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe2);
    std::operator<<(poVar2," v_==\"m:hg/x:x\"");
    local_1d9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1d8);
    local_1d9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"h0",&local_201);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_200);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_380);
    poVar2 = std::operator<<((ostream *)local_380,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe3);
    std::operator<<(poVar2," v_==\"-\"");
    local_3a1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_3a0);
    local_3a1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"h1/a1",&local_3c9);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_3c8);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_548);
    poVar2 = std::operator<<((ostream *)local_548,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe4);
    std::operator<<(poVar2," v_==\":1\"");
    local_569 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_568);
    local_569 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"h2/a1/a2",&local_591);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_590);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_710);
    poVar2 = std::operator<<((ostream *)local_710,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe5);
    std::operator<<(poVar2," v_==\":1:2\"");
    local_731 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_730);
    local_731 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_758,"h3/a1/a2/a3",&local_759);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_758);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_8d8);
    poVar2 = std::operator<<((ostream *)local_8d8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe6);
    std::operator<<(poVar2," v_==\":1:2:3\"");
    local_8f9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_8f8);
    local_8f9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_920,"h4/a1/a2/a3/a4",&local_921);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_920);
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_aa0);
    poVar2 = std::operator<<((ostream *)local_aa0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe7);
    std::operator<<(poVar2," v_==\":1:2:3:4\"");
    local_ac1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_ac0);
    local_ac1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae8,"h5/a1/a2/a3/a4/a5",&local_ae9);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_ae8);
  std::__cxx11::string::~string(local_ae8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_c68);
    poVar2 = std::operator<<((ostream *)local_c68,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe8);
    std::operator<<(poVar2," v_==\":1:2:3:4:5\"");
    local_c89 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_c88);
    local_c89 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb0,"h6/a1/a2/a3/a4/a5/a6",&local_cb1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_cb0);
  std::__cxx11::string::~string(local_cb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_e30);
    poVar2 = std::operator<<((ostream *)local_e30,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe9);
    std::operator<<(poVar2," v_==\":1:2:3:4:5:6\"");
    local_e51 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_e50);
    local_e51 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e78,"GET",&local_e79);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_e78);
  std::allocator<char>::~allocator((allocator<char> *)&local_e79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ea0,"/h0",&local_ea1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_ea0);
  std::__cxx11::string::~string(local_ea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x136f0d)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"-");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1030);
    poVar2 = std::operator<<((ostream *)local_1030,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xec);
    std::operator<<(poVar2," v_==(\"-\")");
    local_1051 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1050);
    local_1051 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1078,"GET",&local_1079);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_1078);
  std::allocator<char>::~allocator((allocator<char> *)&local_1079);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10a0,"/rh0",&local_10a1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_10a0);
  std::__cxx11::string::~string(local_10a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x1372d3)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"-");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1230);
    poVar2 = std::operator<<((ostream *)local_1230,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xed);
    std::operator<<(poVar2," v_==(\"-\")");
    local_1251 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1250);
    local_1251 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1278,"GET",&local_1279);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_1278);
  std::allocator<char>::~allocator((allocator<char> *)&local_1279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12a0,"/RH0",&local_12a1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_12a0);
  std::__cxx11::string::~string(local_12a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x137699)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"-");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1430);
    poVar2 = std::operator<<((ostream *)local_1430,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xee);
    std::operator<<(poVar2," v_==(\"-\")");
    local_1451 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1450);
    local_1451 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1478,"GET",&local_1479);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_1478);
  std::allocator<char>::~allocator((allocator<char> *)&local_1479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14a0,"/h1_num/123.3",&local_14a1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_14a0);
  std::__cxx11::string::~string(local_14a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14a1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x137a5f)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_d:to_str(123.3)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1630);
    poVar2 = std::operator<<((ostream *)local_1630,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xef);
    std::operator<<(poVar2," v_==(\"h1_d:to_str(123.3)\")");
    local_1651 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1650);
    local_1651 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1678,"GET",&local_1679);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_1678);
  std::allocator<char>::~allocator((allocator<char> *)&local_1679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16a0,"/h1_num/123",&local_16a1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_16a0);
  std::__cxx11::string::~string(local_16a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16a1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x137e25)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_i:to_str(123)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1830);
    poVar2 = std::operator<<((ostream *)local_1830,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf0);
    std::operator<<(poVar2," v_==(\"h1_i:to_str(123)\")");
    local_1851 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1850);
    local_1851 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1878,"GET",&local_1879);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_1878);
  std::allocator<char>::~allocator((allocator<char> *)&local_1879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18a0,"/h1_num/123 23",&local_18a1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_18a0);
  std::__cxx11::string::~string(local_18a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18a1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x1381eb)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"none");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a30);
    poVar2 = std::operator<<((ostream *)local_1a30,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf1);
    std::operator<<(poVar2," v_==(\"none\")");
    local_1a51 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1a50);
    local_1a51 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a78,"GET",&local_1a79);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_1a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1aa0,"/h1_s/1111",&local_1aa1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_1aa0);
  std::__cxx11::string::~string(local_1aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1aa1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x1385b1)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s:1111");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c30);
    poVar2 = std::operator<<((ostream *)local_1c30,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf2);
    std::operator<<(poVar2," v_==(\"h1_s:1111\")");
    local_1c51 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1c50);
    local_1c51 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c78,"GET",&local_1c79);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_1c78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ca0,"/RH1_S/1111",&local_1ca1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_1ca0);
  std::__cxx11::string::~string(local_1ca0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ca1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x138977)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s:1111");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e30);
    poVar2 = std::operator<<((ostream *)local_1e30,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf3);
    std::operator<<(poVar2," v_==(\"h1_s:1111\")");
    local_1e51 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1e50);
    local_1e51 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e78,"GET",&local_1e79);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_1e78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ea0,"/h1_s_c/1111",&local_1ea1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_1ea0);
  std::__cxx11::string::~string(local_1ea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ea1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x138d3d)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s_c:1111");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2030);
    poVar2 = std::operator<<((ostream *)local_2030,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf4);
    std::operator<<(poVar2," v_==(\"h1_s_c:1111\")");
    local_2051 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2050);
    local_2051 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2078,"GET",&local_2079);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_2078);
  std::allocator<char>::~allocator((allocator<char> *)&local_2079);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20a0,"/h1_s_r/1111",&local_20a1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_20a0);
  std::__cxx11::string::~string(local_20a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_20a1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x139103)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s_r:1111");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2230);
    poVar2 = std::operator<<((ostream *)local_2230,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf5);
    std::operator<<(poVar2," v_==(\"h1_s_r:1111\")");
    local_2251 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2250);
    local_2251 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2278,"GET",&local_2279);
  set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
  std::__cxx11::string::~string(local_2278);
  std::allocator<char>::~allocator((allocator<char> *)&local_2279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_22a0,"/h1_s_cr/1111",&local_22a1);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_22a0);
  std::__cxx11::string::~string(local_22a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a1);
  cppcms::application::release_context();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x1394c9)
  ;
  bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
    poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
    poVar2 = std::operator<<(poVar2," exp=");
    poVar2 = std::operator<<(poVar2,"h1_s_cr:1111");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2478,"GET",&local_2479);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_2478);
    std::allocator<char>::~allocator((allocator<char> *)&local_2479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_24a0,anon_var_dwarf_d679,&local_24a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_24a0);
    std::__cxx11::string::~string(local_24a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_24a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13988f);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_2630);
      poVar2 = std::operator<<((ostream *)local_2630,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf7);
      std::operator<<(poVar2," v_==(\"none\")");
      local_2651 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2650);
      local_2651 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2678,"GET",&local_2679);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_2678);
    std::allocator<char>::~allocator((allocator<char> *)&local_2679);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_26a0,anon_var_dwarf_d679,&local_26a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_26a0);
    std::__cxx11::string::~string(local_26a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_26a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x139c55);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_2830);
      poVar2 = std::operator<<((ostream *)local_2830,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf8);
      std::operator<<(poVar2," v_==(\"none\")");
      local_2851 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2850);
      local_2851 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2878,"GET",&local_2879);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_2878);
    std::allocator<char>::~allocator((allocator<char> *)&local_2879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28a0,anon_var_dwarf_d685,&local_28a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_28a0);
    std::__cxx11::string::~string(local_28a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_28a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13a01b);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,anon_var_dwarf_d691);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_2a30);
      poVar2 = std::operator<<((ostream *)local_2a30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xfb);
      std::operator<<(poVar2,
                      " v_==(\"h1_s:\\xD7\\xA9\\xD7\\x9C\\xD7\\x95\\xD7\\x9D\\x20\\xE6\\x97\\xA5\\xE6\\x9C\\xAC\\xE8\\xAA\\x9E\")"
                     );
      local_2a51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2a50);
      local_2a51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a78,"GET",&local_2a79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_2a78);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2aa0,anon_var_dwarf_d6b7,&local_2aa1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_2aa0);
    std::__cxx11::string::~string(local_2aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2aa1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13a3e1);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_2c30);
      poVar2 = std::operator<<((ostream *)local_2c30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xfc);
      std::operator<<(poVar2," v_==(\"none\")");
      local_2c51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2c50);
      local_2c51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c78,"GET",&local_2c79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_2c78);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2ca0,"/res",&local_2ca1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_2ca0);
    std::__cxx11::string::~string(local_2ca0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2ca1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13a7a7);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_0");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_2e30);
      poVar2 = std::operator<<((ostream *)local_2e30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xfe);
      std::operator<<(poVar2," v_==(\"get_0\")");
      local_2e51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_2e50);
      local_2e51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e78,"GET",&local_2e79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_2e78);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2ea0,"/res/a1",&local_2ea1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_2ea0);
    std::__cxx11::string::~string(local_2ea0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2ea1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13ab6d);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_1:to_str(1)");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_3030);
      poVar2 = std::operator<<((ostream *)local_3030,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xff);
      std::operator<<(poVar2," v_==(\"get_1:to_str(1)\")");
      local_3051 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_3050);
      local_3051 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3078,"GET",&local_3079);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_3078);
    std::allocator<char>::~allocator((allocator<char> *)&local_3079);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30a0,"/res/a1/a2",&local_30a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_30a0);
    std::__cxx11::string::~string(local_30a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_30a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13af33);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_2:to_str(1):to_str(2)");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_3230);
      poVar2 = std::operator<<((ostream *)local_3230,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x100);
      std::operator<<(poVar2," v_==(\"get_2:to_str(1):to_str(2)\")");
      local_3251 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_3250);
      local_3251 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3278,"POST",&local_3279);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_3278);
    std::allocator<char>::~allocator((allocator<char> *)&local_3279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_32a0,"/res",&local_32a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_32a0);
    std::__cxx11::string::~string(local_32a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_32a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13b2f9);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_0");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_3430);
      poVar2 = std::operator<<((ostream *)local_3430,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x102);
      std::operator<<(poVar2," v_==(\"p_0\")");
      local_3451 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_3450);
      local_3451 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3478,"POST",&local_3479);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_3478);
    std::allocator<char>::~allocator((allocator<char> *)&local_3479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_34a0,"/res/a1",&local_34a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_34a0);
    std::__cxx11::string::~string(local_34a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_34a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13b6bf);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_1:to_str(1)");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_3630);
      poVar2 = std::operator<<((ostream *)local_3630,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x103);
      std::operator<<(poVar2," v_==(\"p_1:to_str(1)\")");
      local_3651 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_3650);
      local_3651 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3678,"POST",&local_3679);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_3678);
    std::allocator<char>::~allocator((allocator<char> *)&local_3679);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_36a0,"/res/a1/a2",&local_36a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_36a0);
    std::__cxx11::string::~string(local_36a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_36a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13ba85);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_2:to_str(1):to_str(2)");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_3830);
      poVar2 = std::operator<<((ostream *)local_3830,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x104);
      std::operator<<(poVar2," v_==(\"p_2:to_str(1):to_str(2)\")");
      local_3851 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_3850);
      local_3851 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3878,"PUT",&local_3879);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_3878);
    std::allocator<char>::~allocator((allocator<char> *)&local_3879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38a0,"/res",&local_38a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_38a0);
    std::__cxx11::string::~string(local_38a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_38a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13be4b);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_0");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_3a30);
      poVar2 = std::operator<<((ostream *)local_3a30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x106);
      std::operator<<(poVar2," v_==(\"p_0\")");
      local_3a51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_3a50);
      local_3a51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a78,"PUT",&local_3a79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_3a78);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3aa0,"/res/a1",&local_3aa1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_3aa0);
    std::__cxx11::string::~string(local_3aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3aa1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13c211);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_1:to_str(1)");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_3c30);
      poVar2 = std::operator<<((ostream *)local_3c30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x107);
      std::operator<<(poVar2," v_==(\"p_1:to_str(1)\")");
      local_3c51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_3c50);
      local_3c51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c78,"PUT",&local_3c79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_3c78);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3ca0,"/res/a1/a2",&local_3ca1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_3ca0);
    std::__cxx11::string::~string(local_3ca0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3ca1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13c5d7);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"p_2:to_str(1):to_str(2)");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_3e30);
      poVar2 = std::operator<<((ostream *)local_3e30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x108);
      std::operator<<(poVar2," v_==(\"p_2:to_str(1):to_str(2)\")");
      local_3e51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_3e50);
      local_3e51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e78,"DELETE",&local_3e79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_3e78);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3ea0,"/res",&local_3ea1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_3ea0);
    std::__cxx11::string::~string(local_3ea0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3ea1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13c99d);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4030);
      poVar2 = std::operator<<((ostream *)local_4030,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x10a);
      std::operator<<(poVar2," v_==(\"none\")");
      local_4051 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_4050);
      local_4051 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4078,"DELETE",&local_4079);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_4078);
    std::allocator<char>::~allocator((allocator<char> *)&local_4079);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40a0,"/res/a1",&local_40a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_40a0);
    std::__cxx11::string::~string(local_40a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_40a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13cd63);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4230);
      poVar2 = std::operator<<((ostream *)local_4230,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x10b);
      std::operator<<(poVar2," v_==(\"none\")");
      local_4251 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_4250);
      local_4251 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4278,"DELETE",&local_4279);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_4278);
    std::allocator<char>::~allocator((allocator<char> *)&local_4279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_42a0,"/res/a1/a2",&local_42a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_42a0);
    std::__cxx11::string::~string(local_42a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_42a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13d129);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4430);
      poVar2 = std::operator<<((ostream *)local_4430,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x10c);
      std::operator<<(poVar2," v_==(\"none\")");
      local_4451 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_4450);
      local_4451 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4478,"GET",&local_4479);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_4478);
    std::allocator<char>::~allocator((allocator<char> *)&local_4479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_44a0,"/point/123,23",&local_44a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_44a0);
    std::__cxx11::string::~string(local_44a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_44a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13d4ef);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"point:to_str(123)Xto_str(23)");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4630);
      poVar2 = std::operator<<((ostream *)local_4630,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x10e);
      std::operator<<(poVar2," v_==(\"point:to_str(123)Xto_str(23)\")");
      local_4651 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_4650);
      local_4651 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4678,"GET",&local_4679);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_4678);
    std::allocator<char>::~allocator((allocator<char> *)&local_4679);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_46a0,"/point/123",&local_46a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_46a0);
    std::__cxx11::string::~string(local_46a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_46a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13d8b5);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4830);
      poVar2 = std::operator<<((ostream *)local_4830,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x10f);
      std::operator<<(poVar2," v_==(\"none\")");
      local_4851 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_4850);
      local_4851 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4878,"GET",&local_4879);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_4878);
    std::allocator<char>::~allocator((allocator<char> *)&local_4879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48a0,"/point/123,23.2",&local_48a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_48a0);
    std::__cxx11::string::~string(local_48a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_48a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13dc7b);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"none");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4a30);
      poVar2 = std::operator<<((ostream *)local_4a30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x110);
      std::operator<<(poVar2," v_==(\"none\")");
      local_4a51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_4a50);
      local_4a51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a78,"GET",&local_4a79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_4a78);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4aa0,"/foo/abcd",&local_4aa1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_4aa0);
    std::__cxx11::string::~string(local_4aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4aa1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13e041);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"foo:to_str(4)");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4c30);
      poVar2 = std::operator<<((ostream *)local_4c30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x112);
      std::operator<<(poVar2," v_==(\"foo:to_str(4)\")");
      local_4c51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_4c50);
      local_4c51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c78,"GET",&local_4c79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_4c78);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4ca0,"/foo/abcdefg",&local_4ca1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_4ca0);
    std::__cxx11::string::~string(local_4ca0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4ca1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13e407);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"foo:to_str(7)");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4e30);
      poVar2 = std::operator<<((ostream *)local_4e30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x113);
      std::operator<<(poVar2," v_==(\"foo:to_str(7)\")");
      local_4e51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_4e50);
      local_4e51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e78,"GET",&local_4e79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_4e78);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4ea0,"/res_1/a1/a2/a3",&local_4ea1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_4ea0);
    std::__cxx11::string::~string(local_4ea0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4ea1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13e7cd);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_3:1:2:3");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_5030);
      poVar2 = std::operator<<((ostream *)local_5030,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x115);
      std::operator<<(poVar2," v_==(\"get_3:1:2:3\")");
      local_5051 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_5050);
      local_5051 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5078,"GET",&local_5079);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_5078);
    std::allocator<char>::~allocator((allocator<char> *)&local_5079);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50a0,"/res_2/a1/a2/a3",&local_50a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_50a0);
    std::__cxx11::string::~string(local_50a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_50a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13eb93);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_3:1:2:3");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_5230);
      poVar2 = std::operator<<((ostream *)local_5230,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x116);
      std::operator<<(poVar2," v_==(\"get_3:1:2:3\")");
      local_5251 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_5250);
      local_5251 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5278,"GET",&local_5279);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_5278);
    std::allocator<char>::~allocator((allocator<char> *)&local_5279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_52a0,"/res_3/a1/a2/a3",&local_52a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_52a0);
    std::__cxx11::string::~string(local_52a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_52a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13ef59);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_3:1:2:3");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_5430);
      poVar2 = std::operator<<((ostream *)local_5430,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x117);
      std::operator<<(poVar2," v_==(\"get_3:1:2:3\")");
      local_5451 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_5450);
      local_5451 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5478,"GET",&local_5479);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_5478);
    std::allocator<char>::~allocator((allocator<char> *)&local_5479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_54a0,"/res_4/a1/a2/a3",&local_54a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_54a0);
    std::__cxx11::string::~string(local_54a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_54a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13f31f);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_3:1:2:3");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_5630);
      poVar2 = std::operator<<((ostream *)local_5630,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x118);
      std::operator<<(poVar2," v_==(\"get_3:1:2:3\")");
      local_5651 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_5650);
      local_5651 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5678,"GET",&local_5679);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_5678);
    std::allocator<char>::~allocator((allocator<char> *)&local_5679);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_56a0,"/res_1/a1/a2/a3/a4",&local_56a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_56a0);
    std::__cxx11::string::~string(local_56a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_56a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13f6e5);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_4:1:2:3:4");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_5830);
      poVar2 = std::operator<<((ostream *)local_5830,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x11a);
      std::operator<<(poVar2," v_==(\"get_4:1:2:3:4\")");
      local_5851 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_5850);
      local_5851 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5878,"GET",&local_5879);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_5878);
    std::allocator<char>::~allocator((allocator<char> *)&local_5879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58a0,"/res_2/a1/a2/a3/a4",&local_58a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_58a0);
    std::__cxx11::string::~string(local_58a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_58a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13faab);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_4:1:2:3:4");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_5a30);
      poVar2 = std::operator<<((ostream *)local_5a30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x11b);
      std::operator<<(poVar2," v_==(\"get_4:1:2:3:4\")");
      local_5a51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_5a50);
      local_5a51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a78,"GET",&local_5a79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_5a78);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5aa0,"/res_3/a1/a2/a3/a4",&local_5aa1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_5aa0);
    std::__cxx11::string::~string(local_5aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5aa1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x13fe71);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_4:1:2:3:4");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_5c30);
      poVar2 = std::operator<<((ostream *)local_5c30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x11c);
      std::operator<<(poVar2," v_==(\"get_4:1:2:3:4\")");
      local_5c51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_5c50);
      local_5c51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c78,"GET",&local_5c79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_5c78);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5ca0,"/res_4/a1/a2/a3/a4",&local_5ca1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_5ca0);
    std::__cxx11::string::~string(local_5ca0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5ca1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x140237);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_4:1:2:3:4");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_5e30);
      poVar2 = std::operator<<((ostream *)local_5e30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x11d);
      std::operator<<(poVar2," v_==(\"get_4:1:2:3:4\")");
      local_5e51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_5e50);
      local_5e51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e78,"GET",&local_5e79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_5e78);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5ea0,"/res_1/a1/a2/a3/a4/a5",&local_5ea1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_5ea0);
    std::__cxx11::string::~string(local_5ea0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5ea1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x1405fd);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_5:1:2:3:4:5");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_6030);
      poVar2 = std::operator<<((ostream *)local_6030,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x11f);
      std::operator<<(poVar2," v_==(\"get_5:1:2:3:4:5\")");
      local_6051 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_6050);
      local_6051 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6078,"GET",&local_6079);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_6078);
    std::allocator<char>::~allocator((allocator<char> *)&local_6079);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60a0,"/res_2/a1/a2/a3/a4/a5",&local_60a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_60a0);
    std::__cxx11::string::~string(local_60a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_60a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x1409c3);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_5:1:2:3:4:5");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_6230);
      poVar2 = std::operator<<((ostream *)local_6230,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x120);
      std::operator<<(poVar2," v_==(\"get_5:1:2:3:4:5\")");
      local_6251 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_6250);
      local_6251 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6278,"GET",&local_6279);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_6278);
    std::allocator<char>::~allocator((allocator<char> *)&local_6279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_62a0,"/res_3/a1/a2/a3/a4/a5",&local_62a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_62a0);
    std::__cxx11::string::~string(local_62a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_62a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x140d89);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_5:1:2:3:4:5");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_6430);
      poVar2 = std::operator<<((ostream *)local_6430,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x121);
      std::operator<<(poVar2," v_==(\"get_5:1:2:3:4:5\")");
      local_6451 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_6450);
      local_6451 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6478,"GET",&local_6479);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_6478);
    std::allocator<char>::~allocator((allocator<char> *)&local_6479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_64a0,"/res_4/a1/a2/a3/a4/a5",&local_64a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_64a0);
    std::__cxx11::string::~string(local_64a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_64a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x14114f);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_5:1:2:3:4:5");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_6630);
      poVar2 = std::operator<<((ostream *)local_6630,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x122);
      std::operator<<(poVar2," v_==(\"get_5:1:2:3:4:5\")");
      local_6651 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_6650);
      local_6651 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6678,"GET",&local_6679);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_6678);
    std::allocator<char>::~allocator((allocator<char> *)&local_6679);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_66a0,"/res_1/a1/a2/a3/a4/a5/a6",&local_66a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_66a0);
    std::__cxx11::string::~string(local_66a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_66a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x141515);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_6:1:2:3:4:5:6");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_6830);
      poVar2 = std::operator<<((ostream *)local_6830,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x124);
      std::operator<<(poVar2," v_==(\"get_6:1:2:3:4:5:6\")");
      local_6851 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_6850);
      local_6851 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6878,"GET",&local_6879);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_6878);
    std::allocator<char>::~allocator((allocator<char> *)&local_6879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68a0,"/res_2/a1/a2/a3/a4/a5/a6",&local_68a1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_68a0);
    std::__cxx11::string::~string(local_68a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_68a1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x1418db);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_6:1:2:3:4:5:6");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_6a30);
      poVar2 = std::operator<<((ostream *)local_6a30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x125);
      std::operator<<(poVar2," v_==(\"get_6:1:2:3:4:5:6\")");
      local_6a51 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_6a50);
      local_6a51 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6a78,"GET",&local_6a79);
    set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
    std::__cxx11::string::~string(local_6a78);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6aa0,"/res_3/a1/a2/a3/a4/a5/a6",&local_6aa1);
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_6aa0);
    std::__cxx11::string::~string(local_6aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6aa1);
    cppcms::application::release_context();
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x141ca1);
    bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
      poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
      poVar2 = std::operator<<(poVar2," exp=");
      poVar2 = std::operator<<(poVar2,"get_6:1:2:3:4:5:6");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6c78,"GET",&local_6c79);
      set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
      std::__cxx11::string::~string(local_6c78);
      std::allocator<char>::~allocator((allocator<char> *)&local_6c79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6ca0,"/res_4/a1/a2/a3/a4/a5/a6",&local_6ca1);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_6ca0);
      std::__cxx11::string::~string(local_6ca0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6ca1);
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x142067);
      bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_6:1:2:3:4:5:6");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_6e30);
        poVar2 = std::operator<<((ostream *)local_6e30,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x127);
        std::operator<<(poVar2," v_==(\"get_6:1:2:3:4:5:6\")");
        local_6e51 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_6e50);
        local_6e51 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6e78,"GET",&local_6e79);
      set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
      std::__cxx11::string::~string(local_6e78);
      std::allocator<char>::~allocator((allocator<char> *)&local_6e79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6ea0,"/res_1/a1/a2/a3/a4/a5/a6/a7",&local_6ea1);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_6ea0);
      std::__cxx11::string::~string(local_6ea0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6ea1);
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x14242d);
      bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_7:1:2:3:4:5:6:7");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_7030);
        poVar2 = std::operator<<((ostream *)local_7030,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x129);
        std::operator<<(poVar2," v_==(\"get_7:1:2:3:4:5:6:7\")");
        local_7051 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_7050);
        local_7051 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7078,"GET",&local_7079);
      set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
      std::__cxx11::string::~string(local_7078);
      std::allocator<char>::~allocator((allocator<char> *)&local_7079);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70a0,"/res_2/a1/a2/a3/a4/a5/a6/a7",&local_70a1);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_70a0);
      std::__cxx11::string::~string(local_70a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_70a1);
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x1427f3);
      bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_7:1:2:3:4:5:6:7");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_7230);
        poVar2 = std::operator<<((ostream *)local_7230,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12a);
        std::operator<<(poVar2," v_==(\"get_7:1:2:3:4:5:6:7\")");
        local_7251 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_7250);
        local_7251 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7278,"GET",&local_7279);
      set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
      std::__cxx11::string::~string(local_7278);
      std::allocator<char>::~allocator((allocator<char> *)&local_7279);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_72a0,"/res_3/a1/a2/a3/a4/a5/a6/a7",&local_72a1);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_72a0);
      std::__cxx11::string::~string(local_72a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_72a1);
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x142bb9);
      bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_7:1:2:3:4:5:6:7");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_7430);
        poVar2 = std::operator<<((ostream *)local_7430,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,299);
        std::operator<<(poVar2," v_==(\"get_7:1:2:3:4:5:6:7\")");
        local_7451 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_7450);
        local_7451 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7478,"GET",&local_7479);
      set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
      std::__cxx11::string::~string(local_7478);
      std::allocator<char>::~allocator((allocator<char> *)&local_7479);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_74a0,"/res_4/a1/a2/a3/a4/a5/a6/a7",&local_74a1);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_74a0);
      std::__cxx11::string::~string(local_74a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_74a1);
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x142f7f);
      bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_7:1:2:3:4:5:6:7");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_7630);
        poVar2 = std::operator<<((ostream *)local_7630,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,300);
        std::operator<<(poVar2," v_==(\"get_7:1:2:3:4:5:6:7\")");
        local_7651 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_7650);
        local_7651 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7678,"GET",&local_7679);
      set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
      std::__cxx11::string::~string(local_7678);
      std::allocator<char>::~allocator((allocator<char> *)&local_7679);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_76a0,"/res_1/a1/a2/a3/a4/a5/a6/a7/a8",&local_76a1);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_76a0);
      std::__cxx11::string::~string(local_76a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_76a1);
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x143345);
      bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_8:1:2:3:4:5:6:7:8");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_7830);
        poVar2 = std::operator<<((ostream *)local_7830,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12e);
        std::operator<<(poVar2," v_==(\"get_8:1:2:3:4:5:6:7:8\")");
        local_7851 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_7850);
        local_7851 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7878,"GET",&local_7879);
      set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
      std::__cxx11::string::~string(local_7878);
      std::allocator<char>::~allocator((allocator<char> *)&local_7879);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78a0,"/res_2/a1/a2/a3/a4/a5/a6/a7/a8",&local_78a1);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_78a0);
      std::__cxx11::string::~string(local_78a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_78a1);
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x14370b);
      bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_8:1:2:3:4:5:6:7:8");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_7a30);
        poVar2 = std::operator<<((ostream *)local_7a30,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12f);
        std::operator<<(poVar2," v_==(\"get_8:1:2:3:4:5:6:7:8\")");
        local_7a51 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_7a50);
        local_7a51 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7a78,"GET",&local_7a79);
      set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
      std::__cxx11::string::~string(local_7a78);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7aa0,"/res_3/a1/a2/a3/a4/a5/a6/a7/a8",&local_7aa1);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_7aa0);
      std::__cxx11::string::~string(local_7aa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7aa1);
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x143acb);
      bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_8:1:2:3:4:5:6:7:8");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_7c30);
        poVar2 = std::operator<<((ostream *)local_7c30,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x130);
        std::operator<<(poVar2," v_==(\"get_8:1:2:3:4:5:6:7:8\")");
        local_7c51 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_7c50);
        local_7c51 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 5),"none");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7c78,"GET",&local_7c79);
      set_context(in_stack_ffffffffffff73f0,in_stack_ffffffffffff73e8);
      std::__cxx11::string::~string(local_7c78);
      std::allocator<char>::~allocator((allocator<char> *)&local_7c79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7ca0,"/res_4/a1/a2/a3/a4/a5/a6/a7/a8",&local_7ca1);
      (**(code **)(*in_RDI + 0x10))(in_RDI,local_7ca0);
      std::__cxx11::string::~string(local_7ca0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7ca1);
      cppcms::application::release_context();
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x143e5b);
      bVar1 = std::operator!=(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"v=");
        poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 5));
        poVar2 = std::operator<<(poVar2," exp=");
        poVar2 = std::operator<<(poVar2,"get_8:1:2:3:4:5:6:7:8");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      bVar1 = std::operator==(in_stack_ffffffffffff71e0,in_stack_ffffffffffff71d8);
      if (bVar1) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream(local_7e30);
      poVar2 = std::operator<<((ostream *)local_7e30,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x131);
      std::operator<<(poVar2," v_==(\"get_8:1:2:3:4:5:6:7:8\")");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_7e50);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream(local_6c30);
    poVar2 = std::operator<<((ostream *)local_6c30,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x126);
    std::operator<<(poVar2," v_==(\"get_6:1:2:3:4:5:6\")");
    local_6c51 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_6c50);
    local_6c51 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_2430);
  poVar2 = std::operator<<((ostream *)local_2430,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf6);
  std::operator<<(poVar2," v_==(\"h1_s_cr:1111\")");
  local_2451 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar3,local_2450);
  local_2451 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test()
	{
		TESTD("hg/x","m:hg/x:x");
		TESTD("h0","-");
		TESTD("h1/a1",":1");
		TESTD("h2/a1/a2",":1:2");
		TESTD("h3/a1/a2/a3",":1:2:3");
		TESTD("h4/a1/a2/a3/a4",":1:2:3:4");
		TESTD("h5/a1/a2/a3/a4/a5",":1:2:3:4:5");
		TESTD("h6/a1/a2/a3/a4/a5/a6",":1:2:3:4:5:6");


		TESTM("GET","/h0","-");
		TESTM("GET","/rh0","-");
		TESTM("GET","/RH0","-");
		TESTM("GET","/h1_num/123.3","h1_d:to_str(123.3)");
		TESTM("GET","/h1_num/123","h1_i:to_str(123)");
		TESTM("GET","/h1_num/123 23","none");
		TESTM("GET","/h1_s/1111","h1_s:1111");
		TESTM("GET","/RH1_S/1111","h1_s:1111");
		TESTM("GET","/h1_s_c/1111","h1_s_c:1111");
		TESTM("GET","/h1_s_r/1111","h1_s_r:1111");
		TESTM("GET","/h1_s_cr/1111","h1_s_cr:1111");
		TESTM("GET","/h1_s_cr/1111\xFF","none");
		TESTM("GET","/h1_s_cr/1111\xFF","none");
		
		TESTM("GET","/name/\xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D\x20\xE6\x97\xA5\xE6\x9C\xAC\xE8\xAA\x9E",
			   "h1_s:\xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D\x20\xE6\x97\xA5\xE6\x9C\xAC\xE8\xAA\x9E");
		TESTM("GET","/name/\xFF","none");

		TESTM("GET","/res","get_0");
		TESTM("GET","/res/a1","get_1:to_str(1)");
		TESTM("GET","/res/a1/a2","get_2:to_str(1):to_str(2)");
		
		TESTM("POST","/res","p_0");
		TESTM("POST","/res/a1","p_1:to_str(1)");
		TESTM("POST","/res/a1/a2","p_2:to_str(1):to_str(2)");

		TESTM("PUT","/res","p_0");
		TESTM("PUT","/res/a1","p_1:to_str(1)");
		TESTM("PUT","/res/a1/a2","p_2:to_str(1):to_str(2)");

		TESTM("DELETE","/res","none");
		TESTM("DELETE","/res/a1","none");
		TESTM("DELETE","/res/a1/a2","none");

		TESTM("GET","/point/123,23","point:to_str(123)Xto_str(23)");
		TESTM("GET","/point/123","none");
		TESTM("GET","/point/123,23.2","none");

		TESTM("GET","/foo/abcd","foo:to_str(4)");
		TESTM("GET","/foo/abcdefg","foo:to_str(7)");
		
		TESTM("GET","/res_1/a1/a2/a3","get_3:1:2:3");
		TESTM("GET","/res_2/a1/a2/a3","get_3:1:2:3");
		TESTM("GET","/res_3/a1/a2/a3","get_3:1:2:3");
		TESTM("GET","/res_4/a1/a2/a3","get_3:1:2:3");
		
		TESTM("GET","/res_1/a1/a2/a3/a4","get_4:1:2:3:4");
		TESTM("GET","/res_2/a1/a2/a3/a4","get_4:1:2:3:4");
		TESTM("GET","/res_3/a1/a2/a3/a4","get_4:1:2:3:4");
		TESTM("GET","/res_4/a1/a2/a3/a4","get_4:1:2:3:4");
		
		TESTM("GET","/res_1/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");

		TESTM("GET","/res_1/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		
		TESTM("GET","/res_1/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");

		TESTM("GET","/res_1/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
	}